

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  processingInstructionSAXFunc UNRECOVERED_JUMPTABLE;
  uint uVar2;
  int iVar3;
  uint val;
  uint uVar4;
  xmlCatalogAllow xVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  char *msg;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int l;
  int local_34;
  
  uVar9 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar9 = 10000000;
  }
  pxVar1 = ctxt->input;
  pxVar6 = pxVar1->cur;
  if ((*pxVar6 == '<') && (pxVar6[1] == '?')) {
    pxVar1->cur = pxVar6 + 2;
    pxVar1->col = pxVar1->col + 2;
    if (pxVar6[2] == '\0') {
      xmlParserGrow(ctxt);
    }
    pxVar6 = xmlParsePITarget(ctxt);
    if (pxVar6 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_PI_NOT_STARTED,(char *)0x0);
      return;
    }
    pxVar1 = ctxt->input;
    pxVar7 = pxVar1->cur;
    if ((*pxVar7 != '?') || (pxVar7[1] != '>')) {
      pxVar7 = (xmlChar *)(*xmlMalloc)(100);
      if (pxVar7 == (xmlChar *)0x0) {
        xmlCtxtErrMemory(ctxt);
        return;
      }
      iVar3 = xmlSkipBlankChars(ctxt);
      if (iVar3 == 0) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,pxVar6,
                   (xmlChar *)0x0,(xmlChar *)0x0,0,"ParsePI: PI %s space expected\n",pxVar6);
      }
      uVar10 = 100;
      lVar11 = 0;
      do {
        val = xmlCurrentChar(ctxt,&local_34);
        if (val == 0x200000) {
          val = 0xfffd;
        }
        if (0xff < (int)val) {
          if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800))
          goto LAB_00137511;
LAB_001375e6:
          pxVar7[lVar11] = '\0';
          msg = "ParsePI: PI %s never end ...\n";
LAB_00137623:
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_PI_NOT_FINISHED,XML_ERR_FATAL,
                     pxVar6,(xmlChar *)0x0,(xmlChar *)0x0,0,msg,pxVar6);
          goto LAB_0013765d;
        }
        if ((int)val < 0x20) {
          if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) goto LAB_001375e6;
        }
        else if ((val == 0x3f) && (ctxt->input->cur[1] == '>')) {
          pxVar7[lVar11] = '\0';
          pxVar1 = ctxt->input;
          pxVar8 = pxVar1->cur;
          pxVar1->cur = pxVar8 + 2;
          pxVar1->col = pxVar1->col + 2;
          if (pxVar8[2] == '\0') {
            xmlParserGrow(ctxt);
          }
          if ((((ctxt->inSubset == 0) &&
               (iVar3 = xmlStrEqual(pxVar6,(xmlChar *)"oasis-xml-catalog"), iVar3 != 0)) &&
              (xVar5 = xmlCatalogGetDefaults(), (ctxt->options & 0x4000000) != 0)) &&
             ((xVar5 & ~XML_CATA_ALLOW_GLOBAL) == XML_CATA_ALLOW_DOCUMENT)) {
            xmlParseCatalogPI(ctxt,pxVar7);
          }
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
             (UNRECOVERED_JUMPTABLE = ctxt->sax->processingInstruction,
             UNRECOVERED_JUMPTABLE != (processingInstructionSAXFunc)0x0)) {
            (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar6,pxVar7);
          }
          goto LAB_0013765d;
        }
LAB_00137511:
        pxVar8 = pxVar7;
        if (uVar10 <= lVar11 + 5U) {
          if (uVar10 == 0) {
            uVar10 = 1;
          }
          else {
            iVar3 = (int)uVar10;
            if ((int)uVar9 <= iVar3) {
              msg = "PI %s too big found";
              goto LAB_00137623;
            }
            uVar4 = iVar3 + 1U >> 1;
            uVar2 = uVar4 + iVar3;
            if ((int)(uVar9 - uVar4) < iVar3) {
              uVar2 = uVar9;
            }
            uVar10 = (ulong)uVar2;
          }
          pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar7,uVar10);
          if (pxVar8 == (xmlChar *)0x0) {
            xmlCtxtErrMemory(ctxt);
LAB_0013765d:
            (*xmlFree)(pxVar7);
            return;
          }
        }
        if (val < 0x80) {
          pxVar8[lVar11] = (xmlChar)val;
          lVar11 = lVar11 + 1;
        }
        else {
          iVar3 = xmlCopyCharMultiByte(pxVar8 + lVar11,val);
          lVar11 = lVar11 + iVar3;
        }
        pxVar1 = ctxt->input;
        if (*pxVar1->cur == '\n') {
          pxVar1->line = pxVar1->line + 1;
          pxVar1->col = 1;
        }
        else {
          pxVar1->col = pxVar1->col + 1;
        }
        pxVar1->cur = pxVar1->cur + local_34;
        pxVar7 = pxVar8;
      } while( true );
    }
    pxVar1->cur = pxVar7 + 2;
    pxVar1->col = pxVar1->col + 2;
    if (pxVar7[2] == '\0') {
      xmlParserGrow(ctxt);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (UNRECOVERED_JUMPTABLE = ctxt->sax->processingInstruction,
       UNRECOVERED_JUMPTABLE != (processingInstructionSAXFunc)0x0)) {
      (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar6,(xmlChar *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int cur, l;
    const xmlChar *target;

    if ((RAW == '<') && (NXT(1) == '?')) {
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		SKIP(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		return;
	    }
	    buf = xmlMalloc(size);
	    if (buf == NULL) {
		xmlErrMemory(ctxt);
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = xmlCurrentCharRecover(ctxt, &l);
	    while (IS_CHAR(cur) && /* checked */
		   ((cur != '?') || (NXT(1) != '>'))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(size, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                          "PI %s too big found", target);
                        xmlFree(buf);
                        return;
                    }
		    tmp = xmlRealloc(buf, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buf);
			return;
		    }
		    buf = tmp;
                    size = newSize;
		}
		COPY_BUF(buf, len, cur);
		NEXTL(l);
		cur = xmlCurrentCharRecover(ctxt, &l);
	    }
	    buf[len] = 0;
	    if (cur != '?') {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if ((ctxt->inSubset == 0) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();

		    if ((ctxt->options & XML_PARSE_CATALOG_PI) &&
                        ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			 (allow == XML_CATA_ALLOW_ALL)))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
    }
}